

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

void __thiscall PSEngine::PSEngine(PSEngine *this,Config p_config,shared_ptr<PSLogger> *p_logger)

{
  bool bVar1;
  PSLogger local_58;
  PSLogger local_40 [2];
  shared_ptr<PSLogger> *local_20;
  shared_ptr<PSLogger> *p_logger_local;
  PSEngine *this_local;
  Config p_config_local;
  
  this->m_config = p_config;
  local_20 = p_logger;
  p_logger_local = (shared_ptr<PSLogger> *)this;
  this_local = (PSEngine *)p_config;
  std::shared_ptr<PSLogger>::shared_ptr(&this->m_logger,p_logger);
  CompiledGame::CompiledGame(&this->m_compiled_game);
  Level::Level(&this->m_current_level);
  std::vector<PSEngine::Level,_std::allocator<PSEngine::Level>_>::vector(&this->m_level_state_stack)
  ;
  std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::vector
            (&this->m_operation_history);
  TurnHistory::TurnHistory(&this->m_turn_history);
  this->m_last_input = None;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_single_char_obj_alias_cache);
  this->m_is_level_won = false;
  this->m_current_tick_time_elapsed = 0.0;
  ObjectCache::ObjectCache(&this->m_object_cache);
  bVar1 = std::operator==(&this->m_logger,(nullptr_t)0x0);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,
                    "A Logger ptr was not passed to the engine constructor, construction a default one\n"
                   );
    local_58._vptr_PSLogger = (_func_int **)0x0;
    local_58.log_verbosity = None;
    local_58._12_4_ = 0;
    PSLogger::PSLogger(&local_58);
    std::make_shared<PSLogger,PSLogger>(local_40);
    std::shared_ptr<PSLogger>::operator=(&this->m_logger,(shared_ptr<PSLogger> *)local_40);
    std::shared_ptr<PSLogger>::~shared_ptr((shared_ptr<PSLogger> *)local_40);
    PSLogger::~PSLogger(&local_58);
  }
  return;
}

Assistant:

PSEngine::PSEngine(Config p_config, shared_ptr<PSLogger> p_logger /*=nullptr*/) : m_config(p_config), m_logger(p_logger)
{
    if(m_logger == nullptr)
	{
		cout << "A Logger ptr was not passed to the engine constructor, construction a default one\n";
		m_logger = make_shared<PSLogger>(PSLogger());
	}
}